

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O1

expected<idx2::brick_volume,_idx2::idx2_err_code> *
idx2::DecodeTask(expected<idx2::brick_volume,_idx2::idx2_err_code> *__return_storage_ptr__,
                idx2_file *Idx2,params *P,decode_data *D,decode_state Ds,grid OutGrid,f64 Tolerance,
                mmap_volume *OutVol,volume *OutVolMem)

{
  brick_volume *BrickVol_00;
  dtype dVar1;
  out_mode oVar2;
  byte *pbVar3;
  byte *pbVar4;
  allocator *paVar5;
  ulong uVar6;
  i64 iVar7;
  undefined4 uVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  byte bVar13;
  char cVar14;
  int iVar15;
  ulong uVar16;
  mmap_volume *pmVar17;
  ulong uVar18;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *peVar19;
  code *pcVar20;
  uint uVar21;
  long lVar22;
  short *Key;
  ulong *puVar23;
  ulong *puVar24;
  grid *Grid2;
  char *__function;
  long lVar25;
  size_t __n;
  ulong *puVar26;
  ulong *puVar27;
  int iVar28;
  volume *pvVar29;
  uint uVar30;
  ulong *puVar31;
  byte *pbVar32;
  uint uVar33;
  byte *pbVar34;
  brick_volume *Val;
  char cVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  bitstream *BsIn;
  decode_data *D_00;
  ushort uVar40;
  int iVar41;
  int X;
  uint uVar42;
  int iVar43;
  bool bVar44;
  v3i Brick3;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:199:3)>
  __ScopeGuard__199;
  brick_volume BrickVol;
  expected<idx2::brick_volume,_idx2::idx2_err_code> Result;
  unique_lock<std::mutex> Lock_1;
  iterator StreamIt;
  stream_cache Streams;
  int E;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> ReadChunkExpResult;
  grid SbGridNonExt;
  chunk_cache ChunkCache;
  extent PGrid;
  byte local_8ce;
  i8 local_8cd;
  undefined1 local_8cc [52];
  decode_data *local_898;
  undefined8 local_890;
  uint local_888;
  uint local_884;
  short *local_880;
  long local_878;
  volume *local_870;
  ulong local_868;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  long local_850;
  params *local_848;
  byte *local_840;
  ulong local_838;
  mmap_volume *local_830;
  ulong local_828;
  uint local_81c;
  int local_818;
  uint local_814;
  int local_810;
  int local_80c;
  uint local_808;
  int local_804;
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  int local_7f4;
  undefined7 local_7f0;
  idx2_err_code iStack_7e9;
  undefined7 uStack_7e8;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_7e0;
  ulong local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  f64 local_798;
  hash_table<short,_idx2::bitstream> *local_790;
  char local_788;
  mmap_volume *local_780;
  mmap_volume *local_778;
  ulong local_770;
  ulong local_768;
  ulong local_760;
  v3i *local_758;
  undefined **local_750;
  long local_748;
  ulong local_740;
  ulong local_738;
  ulong local_730;
  ulong local_728;
  ulong local_720;
  undefined1 local_718 [73];
  undefined7 uStack_6cf;
  idx2_err_code iStack_6c8;
  undefined7 uStack_6c7;
  allocator *paStack_6c0;
  u64 uStack_6b8;
  undefined8 local_6b0;
  u64 uStack_6a8;
  u64 uStack_6a0;
  undefined2 uStack_698;
  char cStack_696;
  undefined1 uStack_695;
  undefined4 uStack_694;
  char local_690;
  volume local_688;
  u64 uStack_660;
  u64 uStack_658;
  ulong uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  u64 uStack_638;
  undefined8 uStack_630;
  iterator local_628;
  hash_table<short,_idx2::bitstream> local_608;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> local_5d8;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> local_528;
  iterator local_4d8 [16];
  grid local_2d8;
  ulong *local_2b8;
  long local_2a0;
  bitstream local_270;
  volume local_238 [13];
  
  uVar33 = 1;
  iVar36 = 1;
  iVar15 = (int)Ds.Level;
  if (Ds.Level < '\x01') {
    iVar37 = 1;
    pmVar17 = OutVol;
  }
  else {
    iVar37 = 1;
    do {
      iVar37 = iVar37 * (Idx2->GroupBrick3).field_0.field_0.Z;
      uVar33 = (Idx2->GroupBrick3).field_0.field_0.X * uVar33;
      pmVar17 = (mmap_volume *)(ulong)uVar33;
      iVar36 = iVar36 * (Idx2->GroupBrick3).field_0.field_0.Y;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  local_770 = (ulong)((Idx2->BrickDims3).field_0.field_0.X * uVar33);
  local_760 = (ulong)(uint)(iVar36 * (Idx2->BrickDims3).field_0.field_0.Y);
  local_768 = (ulong)(uint)(iVar37 * (Idx2->BrickDims3).field_0.field_0.Z);
  local_648 = Ds.Brick3.field_0._0_8_;
  uStack_640 = Ds._72_8_;
  uStack_630 = Ds._88_8_;
  uStack_638 = Ds.Brick;
  local_688.Type = Ds.ParentBrick.Vol.Type;
  local_688._33_7_ = Ds.ParentBrick.Vol._33_7_;
  uStack_660 = Ds.ParentBrick.ExtentLocal.From;
  uStack_658 = Ds.ParentBrick.ExtentLocal.Dims;
  uStack_650._0_1_ = Ds.ParentBrick.NChildrenDecoded;
  uStack_650._1_1_ = Ds.ParentBrick.NChildrenMax;
  uStack_650._2_1_ = Ds.ParentBrick.Significant;
  uStack_650._3_1_ = Ds.ParentBrick.DoneDecoding;
  uStack_650._4_4_ = Ds.ParentBrick._60_4_;
  local_688.Buffer.Data = Ds.ParentBrick.Vol.Buffer.Data;
  local_688.Buffer.Bytes = Ds.ParentBrick.Vol.Buffer.Bytes;
  local_688.Buffer.Alloc = Ds.ParentBrick.Vol.Buffer.Alloc;
  local_688.Dims = Ds.ParentBrick.Vol.Dims;
  local_878 = (long)Ds.Level;
  local_848 = P;
  local_7e0 = __return_storage_ptr__;
  local_798 = Tolerance;
  local_780 = OutVol;
  local_778 = (mmap_volume *)OutVolMem;
  if (Mallocator()::Instance == '\0') {
    DecodeTask();
  }
  pvVar29 = (volume *)local_718;
  local_718._0_8_ = (byte *)0x0;
  local_718._8_8_ = 0;
  local_718._16_8_ = &Mallocator()::Instance;
  local_718._24_8_ = 0;
  local_718[0x20] = __Invalid__;
  local_718._40_8_ = 0;
  local_718._48_8_ = 0;
  local_718._56_4_ = 0;
  local_758 = &Idx2->BrickDimsExt3;
  Resize(pvVar29,local_758,float64,D->Alloc);
  lVar25 = local_718._24_8_ * 2 >> 0x2b;
  lVar22 = (long)(local_718._24_8_ << 0x16) >> 0x2b;
  if (lVar22 != 0 && (lVar25 != 0 && (local_718._24_8_ & 0x1fffff) != 0)) {
    memset((void *)local_718._0_8_,0,
           lVar25 * lVar22 * ((long)(local_718._24_8_ << 0x2b) >> 0x2b) * 8);
  }
  local_790 = &local_608;
  local_608.LogCapacity = 0;
  local_608.Alloc = (allocator *)0x0;
  local_608.Keys = (short *)0x0;
  local_608.Vals = (bitstream *)0x0;
  local_608.Stats = (bucket_status *)0x0;
  local_608.Size = 0;
  local_788 = '\0';
  if (Mallocator()::Instance == '\0') {
    DecodeTask();
  }
  Init<short,idx2::bitstream>(&local_608,7,(allocator *)&Mallocator()::Instance);
  bVar44 = (char)(Idx2->Subbands).Size == '\0';
  uVar16 = (ulong)bVar44;
  lVar22 = local_878;
  if (bVar44) {
    local_8cc._4_4_ = 0;
  }
  else {
    if ('\x0f' < (char)local_878) goto LAB_0018847b;
    local_818 = (int)local_878 + 1;
    local_81c = (uint)(char)local_818;
    local_7d8 = 0;
    local_750 = &PTR__expected_001d0b60;
    uVar33 = 0;
    local_8cc._4_4_ = 0;
    local_890 = 0;
    local_8cc._44_8_ = Idx2;
    local_898 = D;
    do {
      if (((Idx2->DecodeSubbandMasks).Arr[lVar22] >> (uVar33 & 0x1f) & 1) != 0) {
        pbVar3 = (Idx2->Subbands).Buffer.Data;
        local_840 = pbVar3 + (long)(char)local_890 * 0x40;
        lVar22 = *(long *)(pbVar3 + (long)(char)local_890 * 0x40 + 8);
        iVar15 = (int)((lVar22 << 0x16) >> 0x2b);
        local_870 = pvVar29;
        if (((char)local_890 == '\0') && ((char)local_818 < Idx2->NLevels)) {
          local_828 = CONCAT71(local_828._1_7_,1 < iVar15);
          local_880 = (short *)CONCAT71(local_880._1_7_,1 < lVar22 * 2 >> 0x2b);
          iVar36 = (int)local_648;
          local_8cc._20_4_ = local_648._4_4_;
          local_8cc._28_4_ = (int)uStack_640;
          Brick3.field_0._0_8_ =
               (long)(int)uStack_640 / (long)(Idx2->GroupBrick3).field_0.field_0.Z & 0xffffffff;
          Brick3.field_0._8_4_ =
               (int)((long)(int)local_648 / (long)(Idx2->GroupBrick3).field_0.field_0.X);
          GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_81c,Brick3.field_0._8_4_,Brick3);
          uVar8 = local_8cc._28_4_;
          uVar33 = (int)((lVar22 << 0x2b) >> 0x2b) - (uint)(1 < (lVar22 << 0x2b) >> 0x2b);
          uVar39 = iVar15 - (uint)(byte)local_828;
          uVar38 = (int)(lVar22 * 2 >> 0x2b) - (uint)(byte)local_880;
          local_4d8[0].Key = *(unsigned_long **)local_840;
          local_4d8[0].Ht = *(hash_table<unsigned_long,_idx2::brick_volume> **)(local_840 + 0x10);
          local_4d8[0].Val =
               (brick_volume *)
               ((ulong)(uVar38 & 0x1fffff) << 0x2a |
               (ulong)(uVar39 & 0x1fffff) << 0x15 | (ulong)(uVar33 & 0x1fffff));
          local_238[0].Buffer.Data =
               (byte *)((ulong)(((int)local_8cc._28_4_ % (Idx2->GroupBrick3).field_0.field_0.Z) *
                                uVar38 & 0x1fffff) << 0x2a |
                       (ulong)(((int)local_8cc._20_4_ % (Idx2->GroupBrick3).field_0.field_0.Y) *
                               uVar39 & 0x1fffff) << 0x15 |
                       (ulong)((iVar36 % (Idx2->GroupBrick3).field_0.field_0.X) * uVar33 & 0x1fffff)
                       );
          local_238[0].Buffer.Bytes = (i64)local_4d8[0].Val;
          CopyExtentGrid<double,double>
                    ((extent *)local_238,&local_688,(grid *)local_4d8,(volume *)local_718);
          Idx2 = (idx2_file *)local_8cc._44_8_;
          if (((iVar36 == 0 && local_8cc._20_4_ == 0) && uVar8 == 0) &&
             ((local_848->OutMode != HashMap || ((uStack_650 & 0x10000) == 0)))) {
            Dealloc(&local_688);
            Idx2 = (idx2_file *)local_8cc._44_8_;
          }
        }
        uVar10 = uStack_630;
        D = local_898;
        cVar35 = (char)local_890;
        uStack_630._0_6_ = CONCAT15(cVar35,(undefined5)uStack_630);
        uVar11 = uStack_630;
        lVar22 = *(long *)(local_840 + 8);
        local_7d0 = lVar22 * 2 >> 0x2b;
        uVar33 = ((int)lVar22 << 0xb) >> 0xb;
        local_7c0 = (ulong)uVar33;
        local_7c8 = (ulong)((lVar22 << 0x16) >> 0xb) >> 0x20;
        iVar15 = (Idx2->BlockDims3).field_0.field_0.X;
        iVar36 = (Idx2->BlockDims3).field_0.field_0.Y;
        iVar37 = (Idx2->BlockDims3).field_0.field_0.Z;
        iVar41 = (int)((ulong)(lVar22 << 0x16) >> 0x20);
        iVar43 = (int)((ulong)(lVar22 * 2) >> 0x20);
        uVar16 = (long)(int)(iVar15 + -1 + uVar33) / (long)iVar15;
        local_7a0 = uVar16 & 0xffffffff;
        uVar18 = (long)(iVar36 + -1 + (iVar41 >> 0xb)) / (long)iVar36;
        local_7a8 = uVar18 & 0xffffffff;
        uVar6 = (long)((iVar43 >> 0xb) + iVar37 + -1) / (long)iVar37;
        local_7b8 = uVar6 & 0xffffffff;
        iVar28 = (int)uVar16 * (int)uVar6 * (int)uVar18;
        local_7b0 = uStack_638;
        uStack_630._0_4_ = (int)uVar10;
        iVar9 = (int)uStack_630;
        uStack_630._4_1_ = SUB81(uVar10,4);
        cVar14 = uStack_630._4_1_;
        pmVar17 = (mmap_volume *)(ulong)(uint)(int)uStack_630._4_1_;
        if ((cVar35 == '\0') && ((int)((int)uStack_630._4_1_ + 1U) < (int)Idx2->NLevels)) {
          iVar28 = iVar28 - (int)((long)((ulong)(uint)(iVar43 >> 0x1f) << 0x20 |
                                        local_7d0 & 0xffffffff) / (long)iVar37) *
                            ((int)uVar33 / iVar15) *
                            (int)((long)((ulong)(uint)(iVar41 >> 0x1f) << 0x20 | local_7c8) /
                                 (long)iVar36);
        }
        local_804 = (int)cVar35;
        local_830 = pmVar17;
        uStack_630 = uVar11;
        ParallelReadChunkExponents(&local_528,Idx2,local_898,uStack_638,cVar14,cVar35);
        if (local_528.Ok == false) {
          local_8ce = local_528.field_1.Val.ChunkPos._0_1_;
          local_7f0 = local_528.field_1._1_7_;
          iStack_7e9 = local_528.field_1.Err.Code;
          uStack_7e8 = local_528.field_1._9_7_;
          pvVar29 = (volume *)0x0;
          lVar22 = local_878;
        }
        else {
          bVar12 = Idx2->DType - int64;
          bVar13 = 0;
          if (bVar12 < 4) {
            bVar13 = (byte)(&DAT_001bcae0)[bVar12];
          }
          lVar22 = CONCAT71(local_528.field_1._9_7_,local_528.field_1.Err.Code);
          lVar25 = (long)(iVar28 * iVar9 << (bVar13 & 0x1f));
          local_838 = *(ulong *)(lVar22 + lVar25);
          local_608.Size = 0;
          if (local_608.LogCapacity != 0x3f) {
            __n = 1L << ((byte)local_608.LogCapacity & 0x3f);
            if ((long)__n < 2) {
              __n = 1;
            }
            memset(local_608.Stats,0,__n);
          }
          local_850 = lVar22 + lVar25;
          uVar39 = (int)local_7a0 - 1;
          uVar38 = (int)local_7a8 - 1;
          uVar33 = (int)local_7b8 - 1;
          uVar39 = (uVar39 * 0x100 & 0xffff | uVar39 * 0x10000 | uVar39 & 0xff) & 0x300f00f;
          uVar38 = (uVar38 * 0x100 & 0xffff | uVar38 * 0x10000 | uVar38 & 0xff) & 0x300f00f;
          uVar33 = (uVar33 * 0x100 & 0xffff | uVar33 * 0x10000 | uVar33 & 0xff) & 0x300f00f;
          local_7f8 = ((uVar33 << 4 | uVar33) & 0x30c30c3) * 0x14 & 0x24924924 |
                      ((uVar38 << 4 | uVar38) & 0x30c30c3) * 10 & 0x12492492 |
                      ((uVar39 << 4 | uVar39) & 0x30c30c3) * 5 & 0x9249249;
          local_860 = (int)local_830 + 1;
          uVar33 = 0;
          local_888 = 0;
          local_8cc._8_4_ = 0;
          pvVar29 = local_870;
          lVar22 = local_878;
          do {
            uVar39 = (uVar33 & 0x9249249) >> 2 | uVar33 & 0x9249249;
            uVar38 = uVar39 & 0x30c30c3;
            uVar38 = (uVar38 >> 4 | uVar38) & 0x300f00f;
            uVar38 = (uVar39 >> 0x10 & 0x300 | uVar38 >> 8 | uVar38) & 0x3ff;
            if ((int)local_7a0 <= (int)uVar38) {
LAB_00187131:
              iVar15 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
                }
              }
              bVar13 = (char)iVar15 + 1;
              if (uVar33 == 0) {
                bVar13 = 0;
              }
              uVar33 = (uVar33 >> (bVar13 & 0x1f)) + 1 << (bVar13 & 0x1f);
              uVar38 = 4;
              goto LAB_00187ed0;
            }
            uVar42 = uVar33 >> 1 & 0x9249249;
            local_720 = (ulong)(uVar42 >> 2);
            uVar39 = (uVar42 >> 2) + uVar42;
            uVar21 = uVar39 & 0x30c30c3;
            local_7fc = (uVar21 >> 4 | uVar21) & 0x300f00f;
            local_800 = local_7fc >> 8;
            uVar39 = (uVar39 >> 0x10 & 0x300 | local_800 | local_7fc) & 0x3ff;
            if ((int)local_7a8 <= (int)uVar39) goto LAB_00187131;
            uVar21 = uVar33 >> 2 & 0x9249248;
            local_730 = (ulong)uVar21;
            local_728 = (ulong)(uVar33 & 0x24924924);
            uVar21 = (uVar33 & 0x24924924) + uVar21;
            uVar30 = uVar21 >> 2 & 0x30c30c3;
            local_808 = (uVar30 >> 4 | uVar30) & 0x300f00f;
            uVar21 = (uVar21 >> 0x12 & 0x300 | local_808 >> 8 | local_808) & 0x3ff;
            if ((int)local_7b8 <= (int)uVar21) goto LAB_00187131;
            iVar15 = (Idx2->BlockDims3).field_0.field_0.X;
            local_858 = (Idx2->BlockDims3).field_0.field_0.Y;
            local_810 = uVar38 * iVar15;
            local_85c = (Idx2->BlockDims3).field_0.field_0.Z;
            iVar37 = (int)local_7c0 - local_810;
            iVar43 = (int)local_7c8 - uVar39 * local_858;
            iVar41 = (int)local_7d0 - uVar21 * local_85c;
            iVar36 = iVar15;
            if (iVar37 < iVar15) {
              iVar36 = iVar37;
            }
            local_854 = local_858;
            if (iVar43 < local_858) {
              local_854 = iVar43;
            }
            local_80c = local_85c;
            if (iVar41 < local_85c) {
              local_80c = iVar41;
            }
            uVar38 = (uint)(1 < local_80c) + (uint)(1 < local_854) + (uint)(1 < iVar36);
            local_738 = (ulong)uVar38;
            local_8cc._20_8_ = ZEXT48((uint)(1 << (char)uVar38 * '\x02'));
            local_884 = uVar33;
            local_870 = pvVar29;
            local_814 = local_808 >> 8;
            local_740 = (ulong)uVar42;
            memset(local_238,0,0x200);
            D_00 = local_898;
            Idx2 = (idx2_file *)local_8cc._44_8_;
            if (((((char)local_890 == '\0') && (local_860 < *(i8 *)(local_8cc._44_8_ + 0x9e8))) &&
                (iVar15 <= iVar37)) && ((local_858 <= iVar43 && (uVar38 = 4, local_85c <= iVar41))))
            goto LAB_00187ece;
            dVar1 = *(dtype *)(local_8cc._44_8_ + 0x98);
            if ((dVar1 < 10) && ((0x2c0U >> (dVar1 & 0x1f) & 1) != 0)) {
              if (0x30 < (int)local_888) {
                local_838 = *(ulong *)(local_850 + (ulong)(local_888 >> 3));
                local_850 = (ulong)(local_888 >> 3) + local_850;
                local_888 = local_888 & 7;
              }
              uVar40 = (ushort)(local_838 >> ((byte)local_888 & 0x3f)) &
                       (ushort)bitstream::Masks.Arr[0x10];
              local_888 = local_888 + 0x10;
              iVar15 = -0x3ff;
            }
            else {
              if (0x38 < (int)local_888) {
                local_838 = *(ulong *)(local_850 + (ulong)(local_888 >> 3));
                local_850 = (ulong)(local_888 >> 3) + local_850;
                local_888 = local_888 & 7;
              }
              uVar40 = (ushort)(local_838 >> ((byte)local_888 & 0x3f)) &
                       (ushort)bitstream::Masks.Arr[8];
              local_888 = local_888 + 8;
              iVar15 = -0x7f;
            }
            local_8cd = '\0';
            switch(dVar1) {
            case int8:
            case uint8:
              local_8cc._16_4_ = 0x38;
              break;
            case int16:
            case uint16:
              local_8cc._16_4_ = 0x30;
              break;
            case int32:
            case uint32:
            case float32:
              local_8cc._16_4_ = 0x20;
              break;
            case int64:
            case uint64:
            case float64:
              bVar44 = false;
              local_8cc._16_4_ = 0;
              goto LAB_0018725c;
            default:
              local_8cc._16_4_ = 0x40;
              bVar44 = true;
              goto LAB_0018725c;
            }
            bVar44 = false;
LAB_0018725c:
            if (((double)local_798 != 0.0) || (NAN((double)local_798))) {
              frexp((double)local_798,(int *)&local_5d8);
              local_8cc._28_4_ = (int)local_5d8._vptr_expected;
              if ((int)local_5d8._vptr_expected < -0x3fd) {
                local_8cc._28_4_ = -0x3fe;
              }
              local_8cc._28_4_ = local_8cc._28_4_ + -6;
            }
            else {
              local_8cc._28_4_ = -0x405;
            }
            local_828 = (ulong)(uint)((short)uVar40 + iVar15);
            local_8cc._40_4_ = SEXT24((short)((short)uVar40 + iVar15));
            local_8cc._28_4_ = local_8cc._28_4_ - local_8cc._40_4_;
            if (bVar44) {
              local_8cc._12_4_ = 0;
            }
            else {
              local_7f4 = *(int *)((long)Idx2 + 0x9f8);
              iVar15 = (int)local_8cc._20_8_;
              cVar14 = '?';
              Key = (short *)0x3f;
              local_8cc._12_4_ = 0;
              do {
                iVar37 = (int)(short)((short)local_828 + (short)Key);
                iVar36 = iVar37 + 0x400;
                local_8cc._0_2_ = (undefined2)(iVar36 / local_7f4);
                iVar36 = iVar36 % local_7f4;
                local_880 = Key;
                if (((double)local_798 != 0.0) || (NAN((double)local_798))) {
                  frexp((double)local_798,(int *)&local_5d8);
                  Key = (short *)0xfffffc02;
                  iVar41 = (int)local_5d8._vptr_expected;
                  if ((int)local_5d8._vptr_expected < -0x3fd) {
                    iVar41 = -0x3fe;
                  }
                }
                else {
                  iVar41 = -0x3ff;
                }
                iVar37 = iVar37 - iVar41;
                if ((0x38 < iVar37) || (uVar38 = 7, iVar36 != 0)) {
                  Lookup<short,idx2::bitstream>
                            (&local_628,(idx2 *)&local_608,
                             (hash_table<short,_idx2::bitstream> *)local_8cc,Key);
                  uVar16 = local_7b0;
                  BsIn = local_628.Val;
                  if ((local_628.Ht)->Stats[local_628.Idx] != Occupied) {
                    ParallelReadChunk(&local_5d8,(idx2_file *)local_8cc._44_8_,D_00,local_7b0,
                                      (i8)local_830,(i8)local_804,local_8cc._0_2_);
                    if (local_5d8.Ok == false) {
                      local_8ce = local_5d8.field_1.Val.ChunkPos._0_1_;
                      local_7f0 = local_5d8.field_1._1_7_;
                      iStack_7e9 = local_5d8.field_1.Err.Code;
                      uStack_7e8 = local_5d8.field_1._9_7_;
                      local_870 = (volume *)0x0;
                      BsIn = (bitstream *)0x0;
                      cVar35 = '\0';
                    }
                    else {
                      local_868 = CONCAT71(local_868._1_7_,local_5d8.Ok);
                      memcpy(&local_2d8,&local_5d8.field_1,0xa0);
                      puVar23 = local_2b8;
                      puVar26 = (ulong *)(local_2d8.super_extent.Dims + local_2b8 * 8);
                      puVar31 = (ulong *)local_2d8.super_extent.Dims;
                      do {
                        puVar24 = puVar26;
                        if (puVar26 <= puVar31) break;
                        puVar27 = (ulong *)((long)puVar31 +
                                           (((long)puVar26 - (long)puVar31 >> 3) -
                                            ((long)puVar26 - (long)puVar31 >> 0x3f) &
                                           0xfffffffffffffffeU) * 4);
                        uVar18 = *puVar27;
                        if (uVar18 < uVar16) {
                          puVar31 = puVar27 + 1;
                          bVar44 = true;
                          puVar27 = puVar26;
                        }
                        else {
                          bVar44 = uVar16 < uVar18;
                          if (uVar18 <= uVar16) {
                            puVar23 = puVar27;
                            puVar27 = puVar26;
                          }
                        }
                        puVar24 = puVar23;
                        puVar26 = puVar27;
                      } while (bVar44);
                      iVar36 = *(int *)(local_2a0 +
                                       ((long)((long)puVar24 - local_2d8.super_extent.Dims) >> 1));
                      Insert<short,idx2::bitstream>(&local_628,(short *)local_8cc,&local_270);
                      pbVar3 = ((local_628.Val)->Stream).Data;
                      (local_628.Val)->BitPtr = pbVar3 + iVar36;
                      (local_628.Val)->BitBuf = *(u64 *)(pbVar3 + iVar36);
                      (local_628.Val)->BitPos = 0;
                      BsIn = local_628.Val;
                      cVar35 = (char)local_868;
                    }
                    uVar38 = 1;
                    D_00 = local_898;
                    if (cVar35 == '\0') goto LAB_0018774b;
                  }
                  local_8cc[3] = 0x38 < iVar37;
                  pbVar3 = (BsIn->Stream).Data;
                  pbVar4 = BsIn->BitPtr;
                  uVar33 = BsIn->BitPos;
                  local_868 = (ulong)uVar33;
                  if ((int)local_8cc._28_4_ < 8) {
                    Decode<unsigned_long>
                              ((unsigned_long *)local_238,local_8cc._20_4_,(int)local_880,&local_8cd
                               ,BsIn,false);
                  }
                  else {
                    paVar5 = (BsIn->Stream).Alloc;
                    local_5d8.field_1.Err.Code = (idx2_err_code)paVar5;
                    local_5d8.field_1._9_7_ = (undefined7)((ulong)paVar5 >> 8);
                    local_5d8._vptr_expected = (_func_int **)(BsIn->Stream).Data;
                    iVar7 = (BsIn->Stream).Bytes;
                    local_5d8.field_1.Val.ChunkPos._0_1_ = (undefined1)iVar7;
                    local_5d8.field_1._1_7_ = (undefined7)((ulong)iVar7 >> 8);
                    uVar16 = BsIn->BitBuf;
                    uVar38 = (uint)local_8cd;
                    pbVar32 = pbVar4;
                    if ((int)uVar38 < 1) {
                      pbVar34 = (byte *)0x0;
                      uVar18 = local_868;
                    }
                    else {
                      uVar21 = 0x40 - uVar33;
                      uVar39 = uVar38;
                      if ((int)uVar21 < (int)uVar38) {
                        uVar39 = uVar21;
                      }
                      if (0x40 < (int)uVar39) {
LAB_0018843f:
                        __function = 
                        "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                        ;
                        goto LAB_00188454;
                      }
                      pbVar34 = (byte *)(uVar16 >> ((byte)uVar33 & 0x3f) &
                                        bitstream::Masks.Arr[(int)uVar39]);
                      uVar33 = uVar39 + uVar33;
                      uVar18 = (ulong)uVar33;
                      if ((int)uVar21 < (int)uVar38) {
                        iVar36 = uVar38 - uVar39;
                        if (0x40 < iVar36) goto LAB_0018843f;
                        local_748 = (long)((int)uVar33 >> 3);
                        uVar16 = *(ulong *)(pbVar4 + local_748);
                        pbVar34 = (byte *)((ulong)pbVar34 |
                                          (uVar16 >> (sbyte)(uVar33 & 7) &
                                          bitstream::Masks.Arr[iVar36]) << ((byte)uVar39 & 0x3f));
                        uVar18 = (ulong)((uVar33 & 7) + iVar36);
                        pbVar32 = pbVar4 + local_748;
                      }
                    }
                    uVar33 = (uint)uVar18;
                    uVar39 = uVar38;
                    while ((int)uVar39 < (int)local_8cc._20_4_) {
                      uVar39 = (uint)uVar18;
                      if (0x3f < (int)uVar39) {
                        uVar16 = *(ulong *)(pbVar32 + (uVar18 >> 3));
                        pbVar32 = pbVar32 + (uVar18 >> 3);
                        uVar39 = uVar39 & 7;
                      }
                      uVar33 = uVar39 + 1;
                      uVar18 = (ulong)uVar33;
                      if ((uVar16 >> ((byte)uVar39 & 0x3f) & bitstream::Masks.Arr[1]) == 0) break;
                      while( true ) {
                        uVar33 = (uint)uVar18;
                        bVar13 = (byte)uVar38;
                        if (iVar15 + -1 <= (int)(char)bVar13) break;
                        if (0x3f < (int)uVar33) {
                          uVar16 = *(ulong *)(pbVar32 + (uVar18 >> 3));
                          pbVar32 = pbVar32 + (uVar18 >> 3);
                          uVar33 = uVar33 & 7;
                        }
                        uVar18 = (ulong)(uVar33 + 1);
                        if ((uVar16 >> ((byte)uVar33 & 0x3f) & bitstream::Masks.Arr[1]) != 0) break;
                        uVar38 = (uint)(byte)(bVar13 + 1);
                      }
                      uVar33 = (uint)uVar18;
                      uVar38 = uVar38 + 1;
                      local_8cd = (i8)uVar38;
                      pbVar34 = pbVar34 + (1L << (bVar13 & 0x3f));
                      uVar39 = (uint)local_8cd;
                    }
                    (&local_238[0].Buffer.Data)[0x3f - (int)local_880] = pbVar34;
                    (BsIn->Stream).Alloc = paVar5;
                    (BsIn->Stream).Data = (byte *)local_5d8._vptr_expected;
                    (BsIn->Stream).Bytes = iVar7;
                    BsIn->BitPtr = pbVar32;
                    BsIn->BitBuf = uVar16;
                    BsIn->BitPos = uVar33;
                  }
                  local_8cc._12_4_ =
                       CONCAT31(SUB43(local_8cc._12_4_,1),(char)local_8cc._12_4_ + local_8cc[3]);
                  LOCK();
                  (local_898->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
                       (local_898->BytesDecoded_).super___atomic_base<unsigned_long>._M_i +
                       ((long)BsIn->BitPos - (long)(int)local_868) +
                       (long)(BsIn->BitPtr +
                             ((long)pbVar3 - (long)(pbVar4 + (long)(BsIn->Stream).Data))) * 8;
                  UNLOCK();
                  uVar38 = 0;
                  D_00 = local_898;
                }
LAB_0018774b:
                Idx2 = (idx2_file *)local_8cc._44_8_;
                if (uVar38 != 0) goto LAB_00187779;
                cVar14 = cVar14 + -1;
                Key = (short *)(ulong)(uint)(int)cVar14;
              } while ((int)local_8cc._16_4_ <= (int)cVar14);
            }
            uVar38 = 7;
LAB_00187779:
            if (uVar38 == 7) {
              uVar38 = 0;
              if ('\0' < local_8cc[0xc]) {
                if (7 < (int)local_8cc._28_4_) {
                  TransposeRecursive<unsigned_long>((unsigned_long *)local_238,(int)local_8cc[0xc]);
                }
                LOCK();
                (D_00->NSignificantBlocks).super___atomic_base<long>._M_i =
                     (D_00->NSignificantBlocks).super___atomic_base<long>._M_i + 1;
                UNLOCK();
                peVar19 = (expected<idx2::brick_volume,_idx2::idx2_err_code> *)
                          (*(code *)(&DAT_001bcb58 +
                                    *(int *)(&DAT_001bcb58 + (local_738 & 0xffffffff) * 4)))();
                return peVar19;
              }
            }
LAB_00187ece:
            uVar33 = local_884 + 1;
            pvVar29 = local_870;
            lVar22 = local_878;
LAB_00187ed0:
            pmVar17 = (mmap_volume *)0x300;
            if ((uVar38 & 3) != 0) goto LAB_00187ee6;
          } while (uVar33 <= local_7f8);
          uVar38 = 2;
LAB_00187ee6:
          D = local_898;
          if (uVar38 == 2) {
            local_8ce = (byte)local_8cc._8_4_;
            LOCK();
            (local_898->NInsignificantSubbands).super___atomic_base<long>._M_i =
                 (local_898->NInsignificantSubbands).super___atomic_base<long>._M_i +
                 (ulong)(local_8ce ^ 1);
            UNLOCK();
            pvVar29 = (volume *)CONCAT71((int7)((ulong)pvVar29 >> 8),1);
          }
        }
        if (((ulong)pvVar29 & 1) == 0) {
          local_718._64_8_ = local_750;
          local_718[0x48] = local_8ce;
          uStack_6c7 = uStack_7e8;
          uStack_6cf = local_7f0;
          iStack_6c8 = iStack_7e9;
          local_690 = '\0';
        }
        else {
          uVar33 = local_8cc._4_4_ & 1;
          local_8cc._4_4_ = ZEXT14(local_8ce);
          if (uVar33 != 0) {
            local_8cc._4_4_ = 1;
          }
        }
        if (((ulong)pvVar29 & 1) == 0) break;
      }
      cVar14 = (char)local_890 + '\x01';
      local_890 = CONCAT71((int7)((ulong)local_890 >> 8),cVar14);
      uVar33 = (uint)cVar14;
      cVar14 = (char)(Idx2->Subbands).Size;
      bVar44 = (int)cVar14 == uVar33;
      local_7d8 = (ulong)CONCAT31(cVar14 >> 7,bVar44);
    } while (!bVar44);
    local_8cc._4_4_ = local_8cc._4_4_ & 0xffffff01;
    uVar16 = local_7d8;
  }
  if ((uVar16 & 1) != 0) {
    pmVar17 = (mmap_volume *)local_718;
    InverseCdf53(local_758,(int)uStack_630._4_1_,&Idx2->Subbands,&Idx2->TransformDetails,
                 (volume *)pmVar17,(int)lVar22 + 1 == (int)Idx2->NLevels);
    cStack_696 = (char)local_8cc._4_4_;
    local_718[0x3a] = cStack_696;
    local_718[0x3b] = 1;
    local_718._64_8_ = &PTR__expected_001d0b60;
    local_718[0x48] = (byte)local_718._0_8_;
    uStack_6cf = SUB87(local_718._0_8_,1);
    iStack_6c8 = (idx2_err_code)local_718._8_8_;
    uStack_6c7 = SUB87(local_718._8_8_,1);
    paStack_6c0 = (allocator *)local_718._16_8_;
    uStack_6b8 = local_718._24_8_;
    local_6b0 = CONCAT71(local_718._33_7_,local_718[0x20]);
    uStack_6a8 = local_718._40_8_;
    uStack_6a0 = local_718._48_8_;
    uStack_698 = local_718._56_2_;
    uStack_695 = 1;
    uStack_694 = local_718._60_4_;
    local_690 = '\x01';
  }
  if (local_788 == '\0') {
    Dealloc<short,idx2::bitstream>(local_790);
  }
  BrickVol_00 = (brick_volume *)(local_718 + 0x48);
  if (local_690 == '\0') {
    local_7e0->_vptr_expected = (_func_int **)&PTR__expected_001d0b60;
    (local_7e0->field_1).Val.Vol.Buffer.Data = (byte *)CONCAT71(uStack_6cf,local_718[0x48]);
    (local_7e0->field_1).Val.Vol.Buffer.Bytes = CONCAT71(uStack_6c7,iStack_6c8);
    bVar44 = false;
    goto LAB_00188408;
  }
  if ((long)Ds.Level == 0) {
LAB_001881e3:
    local_238[0].Buffer.Data =
         (byte *)((ulong)((int)local_768 * Ds.Brick3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                 (ulong)((int)local_760 * Ds.Brick3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                 (ulong)((int)local_770 * Ds.Brick3.field_0.field_0.X & 0x1fffff));
    Val = (brick_volume *)0x1fffff;
    local_238[0].Buffer.Bytes =
         (ulong)((Idx2->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
         ((ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
         (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X & 0x1fffff;
    Grid2 = (grid *)((1L << (Ds.Level & 0x3fU) & 0x1fffffU) * 0x40000200001);
    local_238[0].Buffer.Alloc = (allocator *)Grid2;
    Crop<idx2::grid,idx2::grid>((grid *)&local_5d8,(idx2 *)&OutGrid,(grid *)local_238,Grid2);
    Relative<idx2::grid,idx2::grid>(&local_2d8,(idx2 *)&local_5d8,(grid *)local_238,Grid2);
    oVar2 = local_848->OutMode;
    if (oVar2 < HashMap) {
      pmVar17 = local_778;
      if (oVar2 == RegularGridFile) {
        pmVar17 = local_780;
      }
      dVar1 = (pmVar17->Vol).Type;
      Relative<idx2::grid,idx2::grid>((grid *)local_4d8,(idx2 *)&local_5d8,&OutGrid,Grid2);
      if (dVar1 == float32) {
        pcVar20 = CopyGridGrid<double,float>;
      }
      else {
        pcVar20 = CopyGridGrid<double,double>;
      }
      (*pcVar20)(&local_2d8,BrickVol_00,local_4d8,pmVar17);
      Dealloc(BrickVol_00);
    }
    else {
      if (oVar2 == HashMap) {
        if (cStack_696 == '\x01') {
          local_528._vptr_expected = (_func_int **)((long)Ds.Level + Ds.Brick * 0x10);
          local_688.Buffer.Data = (byte *)&D->BrickPoolMutex;
          local_688.Buffer.Bytes = local_688.Buffer.Bytes & 0xffffffffffffff00;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_688);
          local_688.Buffer.Bytes = CONCAT71(local_688.Buffer.Bytes._1_7_,1);
          Insert<unsigned_long,idx2::brick_volume>
                    (local_4d8,(idx2 *)&D->BrickPool,
                     (hash_table<unsigned_long,_idx2::brick_volume> *)&local_528,
                     (unsigned_long *)BrickVol_00,Val);
          pvVar29 = &local_688;
          goto LAB_001883a2;
        }
      }
      else if (oVar2 != NoOutput) goto LAB_001883da;
      Dealloc(BrickVol_00);
    }
  }
  else {
    if ('\x10' < Ds.Level) {
LAB_0018847b:
      __function = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_00188454:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,__function);
    }
    if ((Idx2->DecodeSubbandMasks).Arr[(long)Ds.Level + -1] == '\0') goto LAB_001881e3;
    if ((local_848->OutMode == HashMap) && (cStack_696 == '\x01')) {
      local_5d8._vptr_expected = (_func_int **)((long)(int)Ds.Level + Ds.Brick * 0x10);
      local_238[0].Buffer.Data = (byte *)&D->BrickPoolMutex;
      local_238[0].Buffer.Bytes = local_238[0].Buffer.Bytes & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_238);
      local_238[0].Buffer.Bytes = CONCAT71(local_238[0].Buffer.Bytes._1_7_,1);
      Insert<unsigned_long,idx2::brick_volume>
                (local_4d8,(idx2 *)&D->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&local_5d8,
                 (unsigned_long *)BrickVol_00,(brick_volume *)pmVar17);
      pvVar29 = local_238;
LAB_001883a2:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)pvVar29);
    }
  }
LAB_001883da:
  local_7e0->_vptr_expected = (_func_int **)&PTR__expected_001d0b60;
  (local_7e0->field_1).Val.Vol.Buffer.Data = (byte *)CONCAT71(uStack_6cf,local_718[0x48]);
  (local_7e0->field_1).Val.Vol.Buffer.Bytes = CONCAT71(uStack_6c7,iStack_6c8);
  (local_7e0->field_1).Val.Vol.Buffer.Alloc = paStack_6c0;
  (local_7e0->field_1).Val.Vol.Dims = uStack_6b8;
  *(undefined8 *)&(local_7e0->field_1).Val.Vol.Type = local_6b0;
  (local_7e0->field_1).Val.ExtentLocal.From = uStack_6a8;
  (local_7e0->field_1).Val.ExtentLocal.Dims = uStack_6a0;
  *(ulong *)((long)&local_7e0->field_1 + 0x38) =
       CONCAT44(uStack_694,CONCAT13(uStack_695,CONCAT12(cStack_696,uStack_698)));
  bVar44 = true;
LAB_00188408:
  local_7e0->Ok = bVar44;
  return local_7e0;
}

Assistant:

expected<brick_volume, idx2_err_code>
DecodeTask(const idx2_file& Idx2,
           const params& P,
           decode_data* D,
           decode_state Ds,
           grid OutGrid,
           f64 Tolerance,
           mmap_volume* OutVol,
           volume* OutVolMem)
{
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Ds.Level);
  /* --------------- Decode the brick --------------- */
  auto Result = ParallelDecodeBrick(Idx2, P, D, Ds, Tolerance);
  if (!Result)
    return Error(Result);
  // Copy the samples out to the output buffer (or file)
  // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
  // will be decoded, so we can now just copy the result out
  brick_volume& BVol = Value(Result);
  if (Ds.Level == 0 || Idx2.DecodeSubbandMasks[Ds.Level - 1] == 0)
  {
    grid BrickGrid(Ds.Brick3 * B3, Idx2.BrickDims3, v3i(1 << Ds.Level));
    grid OutBrickGrid = Crop(OutGrid, BrickGrid);
    grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
    if (P.OutMode == params::out_mode::RegularGridFile ||
        P.OutMode == params::out_mode::RegularGridMem)
    {
      auto OutputVol =
        P.OutMode == params::out_mode::RegularGridFile ? &OutVol->Vol : OutVolMem;
      auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                        : (CopyGridGrid<f64, f64>);
      CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
      Dealloc(&BVol); // TODO: dealloc here or outside?
    }
    else if (P.OutMode == params::out_mode::HashMap)
    {
      if (!BVol.Significant)
      {
        Dealloc(&BVol);
      }
      else
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
    else if (P.OutMode == params::out_mode::NoOutput)
    {
      Dealloc(&BVol);
    }
  }
  else // not the finest level
  {
    if (P.OutMode == params::out_mode::HashMap)
    {
      if (BVol.Significant)
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
  }

  return Value(Result);
}